

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
despot::Parser::GetNoisyNextState
          (Parser *this,vector<int,_std::allocator<int>_> *state,ACT_TYPE action,double *random)

{
  value_type vVar1;
  const_reference cVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  const_reference this_00;
  const_reference ppCVar8;
  int local_30;
  int local_2c;
  int s_1;
  int s;
  double *random_local;
  ACT_TYPE action_local;
  vector<int,_std::allocator<int>_> *state_local;
  Parser *this_local;
  
  local_2c = 0;
  while( true ) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(state);
    if (sVar4 <= (ulong)(long)local_2c) break;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](state,(long)local_2c);
    vVar1 = *pvVar5;
    pvVar6 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                       (&this->prev_state_vars_,(long)local_2c);
    (pvVar6->super_NamedVar).super_Variable.curr_value = vVar1;
    local_2c = local_2c + 1;
  }
  pvVar7 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                     (&this->action_vars_,0);
  (pvVar7->super_Variable).curr_value = action;
  local_30 = 0;
  while( true ) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(state);
    if (sVar4 <= (ulong)(long)local_30) break;
    this_00 = std::
              vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ::operator[](&this->is_identity_,(long)local_30);
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(long)action);
    if (!cVar2) {
      ppCVar8 = std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::operator[]
                          (&this->noisy_transition_funcs_,(long)local_30);
      iVar3 = (*((*ppCVar8)->super_Function)._vptr_Function[0xe])(*ppCVar8,random);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](state,(long)local_30);
      *pvVar5 = iVar3;
    }
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void Parser::GetNoisyNextState(vector<int>& state, ACT_TYPE action,
	double& random) const {
	for (int s = 0; s < state.size(); s++) {
		prev_state_vars_[s].curr_value = state[s];
	}
	action_vars_[0].curr_value = action;

	for (int s = 0; s < state.size(); s++) {
		if (!is_identity_[s][action])
			state[s] = noisy_transition_funcs_[s]->ComputeCurrentIndex(random);
	}
}